

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O0

void __thiscall
OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
AttribKernelT(AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              *this)

{
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [48];
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *local_10;
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_local;
  
  local_10 = this;
  TriConnectivity::TriConnectivity((TriConnectivity *)this);
  *(undefined ***)this = &PTR__AttribKernelT_003dd068;
  VPropHandleT<OpenMesh::VectorT<double,_3>_>::VPropHandleT(&this->points_,-1);
  VPropHandleT<OpenMesh::VectorT<double,_3>_>::VPropHandleT(&this->vertex_normals_,-1);
  VPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>::VPropHandleT(&this->vertex_colors_,-1);
  VPropHandleT<double>::VPropHandleT(&this->vertex_texcoords1D_,-1);
  VPropHandleT<OpenMesh::VectorT<double,_2>_>::VPropHandleT(&this->vertex_texcoords2D_,-1);
  VPropHandleT<OpenMesh::VectorT<double,_3>_>::VPropHandleT(&this->vertex_texcoords3D_,-1);
  HPropHandleT<double>::HPropHandleT(&this->halfedge_texcoords1D_,-1);
  HPropHandleT<OpenMesh::VectorT<double,_2>_>::HPropHandleT(&this->halfedge_texcoords2D_,-1);
  HPropHandleT<OpenMesh::VectorT<double,_3>_>::HPropHandleT(&this->halfedge_texcoords3D_,-1);
  HPropHandleT<OpenMesh::VectorT<double,_3>_>::HPropHandleT(&this->halfedge_normals_,-1);
  HPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>::HPropHandleT(&this->halfedge_colors_,-1);
  EPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>::EPropHandleT(&this->edge_colors_,-1);
  FPropHandleT<OpenMesh::VectorT<double,_3>_>::FPropHandleT(&this->face_normals_,-1);
  FPropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>::FPropHandleT(&this->face_colors_,-1);
  FPropHandleT<int>::FPropHandleT(&this->face_texture_index_,-1);
  VPropHandleT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  ::VPropHandleT(&this->data_vpph_,-1);
  HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  ::HPropHandleT(&this->data_hpph_,-1);
  EPropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  ::EPropHandleT(&this->data_epph_,-1);
  FPropHandleT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  ::FPropHandleT(&this->data_fpph_,-1);
  this->refcount_vnormals_ = 0;
  this->refcount_vcolors_ = 0;
  this->refcount_vtexcoords1D_ = 0;
  this->refcount_vtexcoords2D_ = 0;
  this->refcount_vtexcoords3D_ = 0;
  this->refcount_htexcoords1D_ = 0;
  this->refcount_htexcoords2D_ = 0;
  this->refcount_htexcoords3D_ = 0;
  this->refcount_henormals_ = 0;
  this->refcount_hecolors_ = 0;
  this->refcount_ecolors_ = 0;
  this->refcount_fnormals_ = 0;
  this->refcount_fcolors_ = 0;
  this->refcount_ftextureIndex_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"v:points",&local_41);
  BaseKernel::add_property<OpenMesh::VectorT<double,3>>
            ((BaseKernel *)this,&this->points_,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  request_vertex_normals(this);
  request_vertex_colors(this);
  ArrayKernel::request_vertex_status((ArrayKernel *)this);
  ArrayKernel::request_halfedge_status((ArrayKernel *)this);
  ArrayKernel::request_edge_status((ArrayKernel *)this);
  request_edge_colors(this);
  request_face_normals(this);
  request_face_colors(this);
  ArrayKernel::request_face_status((ArrayKernel *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"<vprop>",&local_69);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
            ((BaseKernel *)this,&this->data_vpph_,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"<fprop>",&local_91);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
            ((BaseKernel *)this,&this->data_fpph_,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"<hprop>",&local_b9);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
            ((BaseKernel *)this,&this->data_hpph_,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"<eprop>",&local_e1);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
            ((BaseKernel *)this,&this->data_epph_,(string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return;
}

Assistant:

AttribKernelT()
  : refcount_vnormals_(0),
    refcount_vcolors_(0),
    refcount_vtexcoords1D_(0),
    refcount_vtexcoords2D_(0),
    refcount_vtexcoords3D_(0),
    refcount_htexcoords1D_(0),
    refcount_htexcoords2D_(0),
    refcount_htexcoords3D_(0),
    refcount_henormals_(0),
    refcount_hecolors_(0),
    refcount_ecolors_(0),
    refcount_fnormals_(0),
    refcount_fcolors_(0),
    refcount_ftextureIndex_(0)
  {
    this->add_property( points_, "v:points" );

    if (VAttribs & Attributes::Normal)
      request_vertex_normals();

    if (VAttribs & Attributes::Color)
      request_vertex_colors();

    if (VAttribs & Attributes::TexCoord1D)
      request_vertex_texcoords1D();

    if (VAttribs & Attributes::TexCoord2D)
      request_vertex_texcoords2D();

    if (VAttribs & Attributes::TexCoord3D)
      request_vertex_texcoords3D();

    if (HAttribs & Attributes::TexCoord1D)
      request_halfedge_texcoords1D();

    if (HAttribs & Attributes::TexCoord2D)
      request_halfedge_texcoords2D();

    if (HAttribs & Attributes::TexCoord3D)
      request_halfedge_texcoords3D();

    if (HAttribs & Attributes::Color)
      request_halfedge_colors();

    if (VAttribs & Attributes::Status)
      Connectivity::request_vertex_status();

    if (HAttribs & Attributes::Status)
      Connectivity::request_halfedge_status();

    if (HAttribs & Attributes::Normal)
      request_halfedge_normals();

    if (EAttribs & Attributes::Status)
      Connectivity::request_edge_status();
    
    if (EAttribs & Attributes::Color)
      request_edge_colors();

    if (FAttribs & Attributes::Normal)
      request_face_normals();

    if (FAttribs & Attributes::Color)
      request_face_colors();

    if (FAttribs & Attributes::Status)
      Connectivity::request_face_status();

    if (FAttribs & Attributes::TextureIndex)
      request_face_texture_index();

    //FIXME: data properties might actually cost storage even
    //if there are no data traits??
    this->add_property(data_vpph_);
    this->add_property(data_fpph_);
    this->add_property(data_hpph_);
    this->add_property(data_epph_);
  }